

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::sendErrorToFederates(CommonCore *this,int errorCode,string_view message)

{
  uint uVar1;
  FedInfo **ppFVar2;
  long lVar3;
  uint uVar4;
  size_t size;
  uint uVar5;
  FedInfo **ppFVar6;
  FedInfo **ppFVar7;
  FedInfo *pFVar8;
  ActionMessage errorCom;
  ActionMessage AStack_e8;
  
  size = message._M_len;
  ActionMessage::ActionMessage(&AStack_e8,cmd_local_error);
  AStack_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  AStack_e8.messageID = errorCode;
  AStack_e8.payload.bufferSize = size;
  if ((AStack_e8.payload.heap != (byte *)message._M_str) &&
     (SmallBuffer::reserve(&AStack_e8.payload,size), size != 0)) {
    memcpy(AStack_e8.payload.heap,message._M_str,size);
  }
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar1 = (this->loopFederates).dataStorage.bsize;
    ppFVar2 = (this->loopFederates).dataStorage.dataptr;
    if ((long)(int)uVar1 == 0x20) {
      lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      if (ppFVar2 == (FedInfo **)0x0) {
        ppFVar7 = (FedInfo **)
                  &gmlc::containers::
                   StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                   emptyValue;
      }
      else {
        ppFVar7 = ppFVar2 + lVar3 + 1;
      }
      pFVar8 = *ppFVar7;
      uVar1 = 0;
      uVar4 = 0x20;
    }
    else {
      lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      ppFVar7 = ppFVar2 + lVar3;
      pFVar8 = *ppFVar7 + (int)uVar1;
      uVar4 = uVar1;
    }
  }
  else {
    ppFVar2 = (this->loopFederates).dataStorage.dataptr;
    pFVar8 = *ppFVar2;
    lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    uVar1 = 0;
    ppFVar7 = ppFVar2;
    uVar4 = (this->loopFederates).dataStorage.bsize;
  }
  if (ppFVar2 == (FedInfo **)0x0) {
    ppFVar6 = (FedInfo **)
              &gmlc::containers::
               StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
               emptyValue;
  }
  else {
    ppFVar6 = ppFVar2 + lVar3 + 1;
  }
  ppFVar2 = ppFVar2 + lVar3;
  if (uVar4 == 0x20) {
    ppFVar2 = ppFVar6;
  }
  uVar5 = 0;
  if (uVar4 != 0x20) {
    uVar5 = uVar4;
  }
  while ((uVar1 != uVar5 || (ppFVar7 != ppFVar2))) {
    if ((pFVar8->fed != (FederateState *)0x0) && (pFVar8->state == OPERATING)) {
      FederateState::addAction(pFVar8->fed,&AStack_e8);
    }
    if ((int)uVar1 < 0x1f) {
      pFVar8 = pFVar8 + 1;
      uVar1 = uVar1 + 1;
    }
    else {
      ppFVar7 = ppFVar7 + (ulong)(uVar1 - 0x1f >> 5) + 1;
      uVar1 = uVar1 + 1 & 0x1f;
      pFVar8 = (FedInfo *)((long)&(*ppFVar7)->fed + (ulong)(uVar1 << 4));
    }
  }
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::sendErrorToFederates(int errorCode, std::string_view message)
{
    ActionMessage errorCom(CMD_LOCAL_ERROR);
    errorCom.source_id = global_broker_id_local;
    errorCom.messageID = errorCode;
    errorCom.payload = message;
    loopFederates.apply([&errorCom](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            fed->addAction(errorCom);
        }
    });
}